

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall ON_SubDFace::SharpEdgeCount(ON_SubDFace *this,ON_SubDEdgeSharpness *sharpness_range)

{
  bool bVar1;
  ushort uVar2;
  uint uVar3;
  ON_SubDEdge *this_00;
  ON_SubDEdgePtr *pOVar4;
  ushort uVar5;
  ON_SubDEdgeSharpness OVar6;
  ON_SubDEdgeSharpness s;
  ON_SubDEdgeSharpness local_38;
  
  *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = (ON_SubDEdgeSharpness)0x0;
  uVar2 = this->m_edge_count;
  if (uVar2 == 0) {
    uVar3 = 0;
  }
  else {
    pOVar4 = this->m_edge4;
    uVar3 = 0;
    uVar5 = 0;
    do {
      if ((uVar5 == 4) && (pOVar4 = this->m_edgex, pOVar4 == (ON_SubDEdgePtr *)0x0)) {
        return uVar3;
      }
      this_00 = (ON_SubDEdge *)(pOVar4->m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) && (bVar1 = ON_SubDEdge::IsSharp(this_00), bVar1)) {
        local_38 = ON_SubDEdge::Sharpness(this_00,false);
        OVar6 = ON_SubDEdgeSharpness::Union(sharpness_range,&local_38);
        *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = OVar6;
        uVar3 = uVar3 + 1;
        uVar2 = this->m_edge_count;
      }
      uVar5 = uVar5 + 1;
      pOVar4 = pOVar4 + 1;
    } while (uVar5 < uVar2);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubDFace::SharpEdgeCount(ON_SubDEdgeSharpness& sharpness_range) const
{
  sharpness_range = ON_SubDEdgeSharpness::Smooth;
  unsigned int sharp_edge_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr == e || false == e->IsSharp())
      continue;
    const ON_SubDEdgeSharpness s = e->Sharpness(false);
    sharpness_range = ON_SubDEdgeSharpness::Union(sharpness_range, s);
    ++sharp_edge_count;
  }
  return sharp_edge_count;
}